

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_extract.cpp
# Opt level: O2

void duckdb::MapExtractListFunc(DataChunk *args,ExpressionState *state,Vector *result)

{
  UnifiedVectorFormat *pUVar1;
  uint64_t uVar2;
  undefined8 *puVar3;
  reference list_v;
  reference target_v;
  Vector *source_v;
  Vector *pVVar4;
  UnifiedVectorFormat *pUVar5;
  list_entry_t *plVar6;
  list_entry_t *plVar7;
  UnifiedVectorFormat *pUVar8;
  UnifiedVectorFormat *pUVar9;
  long lVar10;
  uint64_t *puVar11;
  uint64_t uVar12;
  LogicalType local_188 [24];
  UnifiedVectorFormat pos_format;
  long local_168;
  long local_160;
  UnifiedVectorFormat lst_format;
  long local_118;
  UnifiedVectorFormat val_format;
  Vector pos_vec;
  
  pUVar1 = *(UnifiedVectorFormat **)(args + 0x18);
  list_v = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
  target_v = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,1);
  if ((list_v[8] != (value_type)0x1) && (target_v[8] != (value_type)0x1)) {
    source_v = (Vector *)duckdb::MapVector::GetKeys(list_v);
    pVVar4 = (Vector *)duckdb::MapVector::GetValues(list_v);
    duckdb::LogicalType::LogicalType(local_188,INTEGER);
    duckdb::Vector::Vector(&pos_vec,local_188,pUVar1);
    duckdb::LogicalType::~LogicalType(local_188);
    ListSearchOp<true>(list_v,source_v,target_v,&pos_vec,*(idx_t *)(args + 0x18));
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&val_format);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&pos_format);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&lst_format);
    pUVar5 = (UnifiedVectorFormat *)duckdb::ListVector::GetListSize(list_v);
    duckdb::Vector::ToUnifiedFormat((ulong)pVVar4,pUVar5);
    duckdb::Vector::ToUnifiedFormat((ulong)&pos_vec,pUVar1);
    duckdb::Vector::ToUnifiedFormat((ulong)list_v,pUVar1);
    plVar6 = ListVector::GetData(list_v);
    plVar7 = ListVector::GetData(result);
    puVar11 = &plVar7->length;
    uVar12 = 0;
    for (pUVar5 = (UnifiedVectorFormat *)0x0; pUVar1 != pUVar5; pUVar5 = pUVar5 + 1) {
      pUVar8 = pUVar5;
      if (*_lst_format != 0) {
        pUVar8 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_lst_format + (long)pUVar5 * 4);
      }
      if ((local_118 == 0) ||
         ((*(ulong *)(local_118 + ((ulong)pUVar8 >> 6) * 8) >> ((ulong)pUVar8 & 0x3f) & 1) != 0)) {
        pUVar9 = pUVar5;
        if (*_pos_format != 0) {
          pUVar9 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_pos_format + (long)pUVar5 * 4);
        }
        if ((local_160 == 0) ||
           ((*(ulong *)(local_160 + ((ulong)pUVar9 >> 6) * 8) >> ((ulong)pUVar9 & 0x3f) & 1) != 0))
        {
          uVar2 = plVar6[(long)pUVar8].offset;
          lVar10 = (long)*(int *)(local_168 + (long)pUVar9 * 4);
          ((list_entry_t *)(puVar11 + -1))->offset = uVar12;
          *puVar11 = 1;
          duckdb::ListVector::Append(result,pVVar4,lVar10 + uVar2,(lVar10 + uVar2) - 1);
          uVar12 = uVar12 + 1;
        }
        else {
          ((list_entry_t *)(puVar11 + -1))->offset = uVar12;
          *puVar11 = 0;
        }
      }
      else {
        duckdb::FlatVector::SetNull(result,(ulong)pUVar5,true);
      }
      puVar11 = puVar11 + 2;
    }
    if (*(long *)(args + 0x18) == 1) {
      duckdb::Vector::SetVectorType((VectorType)result);
    }
    duckdb::Vector::Verify((ulong)result);
    UnifiedVectorFormat::~UnifiedVectorFormat(&lst_format);
    UnifiedVectorFormat::~UnifiedVectorFormat(&pos_format);
    UnifiedVectorFormat::~UnifiedVectorFormat(&val_format);
    Vector::~Vector(&pos_vec);
    return;
  }
  duckdb::ListVector::SetListSize(result,0);
  duckdb::Vector::SetVectorType((VectorType)result);
  puVar3 = *(undefined8 **)(result + 0x20);
  *puVar3 = 0;
  puVar3[1] = 0;
  duckdb::Vector::Verify((ulong)result);
  return;
}

Assistant:

static void MapExtractListFunc(DataChunk &args, ExpressionState &state, Vector &result) {
	const auto count = args.size();

	auto &map_vec = args.data[0];
	auto &arg_vec = args.data[1];

	const auto map_is_null = map_vec.GetType().id() == LogicalTypeId::SQLNULL;
	const auto arg_is_null = arg_vec.GetType().id() == LogicalTypeId::SQLNULL;

	if (map_is_null || arg_is_null) {
		// Short-circuit if either the map or the arg is NULL
		ListVector::SetListSize(result, 0);
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::GetData<list_entry_t>(result)[0] = {0, 0};
		result.Verify(count);
		return;
	}

	auto &key_vec = MapVector::GetKeys(map_vec);
	auto &val_vec = MapVector::GetValues(map_vec);

	// Collect the matching positions
	Vector pos_vec(LogicalType::INTEGER, count);
	ListSearchOp<true>(map_vec, key_vec, arg_vec, pos_vec, args.size());

	UnifiedVectorFormat val_format;
	UnifiedVectorFormat pos_format;
	UnifiedVectorFormat lst_format;

	val_vec.ToUnifiedFormat(ListVector::GetListSize(map_vec), val_format);
	pos_vec.ToUnifiedFormat(count, pos_format);
	map_vec.ToUnifiedFormat(count, lst_format);

	const auto pos_data = UnifiedVectorFormat::GetData<int32_t>(pos_format);
	const auto inc_list_data = ListVector::GetData(map_vec);
	const auto out_list_data = ListVector::GetData(result);

	idx_t offset = 0;
	for (idx_t row_idx = 0; row_idx < count; row_idx++) {
		const auto lst_idx = lst_format.sel->get_index(row_idx);
		if (!lst_format.validity.RowIsValid(lst_idx)) {
			FlatVector::SetNull(result, row_idx, true);
			continue;
		}

		auto &inc_list = inc_list_data[lst_idx];
		auto &out_list = out_list_data[row_idx];

		const auto pos_idx = pos_format.sel->get_index(row_idx);
		if (!pos_format.validity.RowIsValid(pos_idx)) {
			// We didnt find the key in the map, so return emptyl ist
			out_list.offset = offset;
			out_list.length = 0;
			continue;
		}

		// Compute the actual position of the value in the map value vector
		const auto pos = inc_list.offset + UnsafeNumericCast<idx_t>(pos_data[pos_idx] - 1);
		out_list.offset = offset;
		out_list.length = 1;
		ListVector::Append(result, val_vec, pos + 1, pos);
		offset++;
	}

	if (args.size() == 1) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}

	result.Verify(count);
}